

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseStart
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer ppTVar2;
  char *pcVar3;
  ulong uVar4;
  pointer pcVar5;
  String SVar6;
  String counts;
  void *local_28 [2];
  
  String::operator=(&this->test_case_name_,(test_case->name_).c_str_);
  uVar4 = 0;
  for (ppTVar2 = (test_case->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 !=
      (test_case->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
    uVar4 = (ulong)((int)uVar4 + (uint)(*ppTVar2)->should_run_);
  }
  pcVar3 = "tests";
  if ((int)uVar4 == 1) {
    pcVar3 = "test";
  }
  SVar6 = String::Format((char *)local_28,"%d %s",uVar4,pcVar3);
  ColoredPrintf(COLOR_GREEN,"[----------] ",SVar6.length_);
  printf("%s from %s",local_28[0],(this->test_case_name_).c_str_);
  pbVar1 = (test_case->type_param_).ptr_;
  if ((pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     ((pbVar1->_M_dataplus)._M_p == (pointer)0x0)) {
    putchar(10);
  }
  else {
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = (pointer)0x0;
    }
    else {
      pcVar5 = (pbVar1->_M_dataplus)._M_p;
    }
    printf(", where TypeParam = %s\n",pcVar5);
  }
  fflush(_stdout);
  if (local_28[0] != (void *)0x0) {
    operator_delete__(local_28[0]);
    return;
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseStart(const TestCase& test_case) {
  test_case_name_ = test_case.name();
  const internal::String counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s", counts.c_str(), test_case_name_.c_str());
  if (test_case.type_param() == NULL) {
    printf("\n");
  } else {
    printf(", where TypeParam = %s\n", test_case.type_param());
  }
  fflush(stdout);
}